

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDEdge::ReplaceFaceInArray(ON_SubDEdge *this,ON_SubDFace *old_face,ON_SubDFace *new_face)

{
  ushort uVar1;
  ON__UINT_PTR direction;
  ON_SubDFacePtr OVar2;
  ON_SubDFacePtr *local_80;
  ON_SubDFacePtr *local_70;
  uint local_64;
  ON_SubDFacePtr *pOStack_50;
  uint c;
  ON_SubDFacePtr *fptr1;
  uint efi1;
  ON_SubDFacePtr *local_38;
  ON_SubDFacePtr *fptr;
  uint efi;
  ON_SubDFace *new_face_local;
  ON_SubDFace *old_face_local;
  ON_SubDEdge *this_local;
  
  if ((old_face == (ON_SubDFace *)0x0) || (old_face == new_face)) {
    local_64 = 0xffffffff;
  }
  else {
    local_64 = FaceArrayIndex(this,old_face);
  }
  fptr._4_4_ = local_64;
  if (local_64 == 0xffffffff) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    if (local_64 < 2) {
      local_70 = this->m_face2 + local_64;
    }
    else {
      local_70 = this->m_facex + (local_64 - 2);
    }
    local_38 = local_70;
    if (new_face == (ON_SubDFace *)0x0) {
      fptr1._4_4_ = local_64 + 1;
      if (fptr1._4_4_ < 2) {
        local_80 = this->m_face2 + fptr1._4_4_;
      }
      else {
        local_80 = this->m_facex + (local_64 - 1);
      }
      pOStack_50 = local_80;
      uVar1 = this->m_face_count;
      this->m_face_count = uVar1 - 1;
      for (; fptr1._4_4_ < uVar1; fptr1._4_4_ = fptr1._4_4_ + 1) {
        if (fptr._4_4_ == 2) {
          local_38 = this->m_facex;
        }
        else if (fptr1._4_4_ == 2) {
          pOStack_50 = this->m_facex;
        }
        local_38->m_ptr = pOStack_50->m_ptr;
        fptr._4_4_ = fptr._4_4_ + 1;
        pOStack_50 = pOStack_50 + 1;
        local_38 = local_38 + 1;
      }
    }
    else {
      direction = ON_SubDFacePtr::FaceDirection(local_70);
      OVar2 = ON_SubDFacePtr::Create(new_face,direction);
      local_70->m_ptr = OVar2.m_ptr;
    }
    this_local._4_4_ = fptr._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_SubDEdge::ReplaceFaceInArray(const ON_SubDFace * old_face, const ON_SubDFace * new_face)
{
  unsigned efi = (nullptr != old_face && old_face != new_face) ? FaceArrayIndex(old_face) : ON_UNSET_UINT_INDEX;
  if (ON_UNSET_UINT_INDEX == efi)
    return ON_UNSET_UINT_INDEX;
  ON_SubDFacePtr* fptr = (efi < 2) ? &m_face2[efi] : &m_facex[efi - 2];
  if (nullptr != new_face)
  {
    *fptr = ON_SubDFacePtr::Create(new_face, fptr->FaceDirection());
  }
  else
  {    
    unsigned efi1 = efi + 1;
    ON_SubDFacePtr* fptr1 = (efi1 < 2) ? &m_face2[efi1] : &m_facex[efi1 - 2];
    for (const unsigned c = (unsigned)(m_face_count--); efi1 < c; ++efi, ++efi1)
    {
      if (2 == efi)
        fptr = m_facex;
      else if (2 == efi1)
        fptr1 = m_facex;
      *fptr++ = *fptr1++;
    }
  }
  return efi;
}